

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestConfigureHandler.cxx
# Opt level: O3

int __thiscall cmCTestConfigureHandler::ProcessHandler(cmCTestConfigureHandler *this)

{
  pointer pcVar1;
  _func_int **pp_Var2;
  cmCTest *pcVar3;
  bool bVar4;
  long lVar5;
  ostream *poVar6;
  long lVar7;
  int iVar8;
  int retVal;
  string cCommand;
  cmXMLWriter xml;
  time_point start_time_time;
  string output;
  string buildDirectory;
  ostringstream cmCTestLog_msg_5;
  string start_time;
  ostringstream cmCTestLog_msg;
  cmGeneratedFileStream ofs;
  int local_77c;
  string local_778;
  string local_758;
  undefined1 local_738 [88];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_6e0;
  string local_6d8;
  string local_6b8;
  undefined1 local_698 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_688 [6];
  ios_base local_628 [264];
  string local_520;
  undefined1 local_500 [32];
  byte abStack_4e0 [80];
  ios_base local_490 [504];
  undefined1 local_298 [16];
  _func_int *local_288 [2];
  byte abStack_278 [80];
  ios_base local_228 [504];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_500,"Configure project",0x11);
  std::ios::widen((char)*(undefined8 *)(local_500._0_8_ + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
               ,0x1a,(char *)local_298._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  if ((_func_int **)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,(ulong)(local_288[0] + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
  std::ios_base::~ios_base(local_490);
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  pcVar1 = local_500 + 0x10;
  local_500._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"ConfigureCommand","");
  cmCTest::GetCTestConfiguration(&local_758,pcVar3,(string *)local_500);
  if ((pointer)local_500._0_8_ != pcVar1) {
    operator_delete((void *)local_500._0_8_,local_500._16_8_ + 1);
  }
  if (local_758._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_500,"Cannot find ConfigureCommand key in the DartConfiguration.tcl",
               0x3d);
    std::ios::widen((char)*(undefined8 *)(local_500._0_8_ + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x20,(char *)local_298._0_8_,false);
    if ((_func_int **)local_298._0_8_ != local_288) {
      operator_delete((void *)local_298._0_8_,(ulong)(local_288[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
    std::ios_base::~ios_base(local_490);
    iVar8 = -1;
    goto LAB_001e1cb9;
  }
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  local_500._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"BuildDirectory","");
  cmCTest::GetCTestConfiguration(&local_6b8,pcVar3,(string *)local_500);
  if ((pointer)local_500._0_8_ != pcVar1) {
    operator_delete((void *)local_500._0_8_,local_500._16_8_ + 1);
  }
  if (local_6b8._M_string_length == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_500,"Cannot find BuildDirectory  key in the DartConfiguration.tcl",
               0x3c);
    std::ios::widen((char)*(undefined8 *)(local_500._0_8_ + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                 ,0x29,(char *)local_298._0_8_,false);
    if ((_func_int **)local_298._0_8_ != local_288) {
      operator_delete((void *)local_298._0_8_,(ulong)(local_288[0] + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
    std::ios_base::~ios_base(local_490);
    iVar8 = -1;
  }
  else {
    lVar5 = std::chrono::_V2::steady_clock::now();
    local_6d8._M_string_length = 0;
    local_6d8.field_2._M_local_buf[0] = '\0';
    local_77c = 0;
    local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
    bVar4 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
    if (bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_500,"Configure with command: ",0x18);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_500,local_758._M_dataplus._M_p,local_758._M_string_length
                         );
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      pcVar3 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                   ,0x5f,(char *)local_298._0_8_,(this->super_cmCTestGenericHandler).Quiet);
      if ((_func_int **)local_298._0_8_ != local_288) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_288[0] + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
      std::ios_base::~ios_base(local_490);
LAB_001e120a:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_500);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_500,"Error(s) when configuring the project",0x25);
      std::ios::widen((char)*(undefined8 *)(local_500._0_8_ + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      pcVar3 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                   ,99,(char *)local_298._0_8_,false);
      if ((_func_int **)local_298._0_8_ != local_288) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_288[0] + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_500);
      std::ios_base::~ios_base(local_490);
      iVar8 = -1;
    }
    else {
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_500,None);
      bVar4 = cmCTestGenericHandler::StartResultingXML
                        (&this->super_cmCTestGenericHandler,PartConfigure,"Configure",
                         (cmGeneratedFileStream *)local_500);
      if (bVar4) {
        cmCTest::CurrentTime_abi_cxx11_(&local_520,(this->super_cmCTestGenericHandler).CTest);
        local_6e0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_298,None);
        cmCTestGenericHandler::StartLogFile
                  (&this->super_cmCTestGenericHandler,"Configure",(cmGeneratedFileStream *)local_298
                  );
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_698);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_698,"Configure with command: ",0x18);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_698,local_758._M_dataplus._M_p,
                            local_758._M_string_length);
        std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x3f,(char *)local_738._0_8_,(this->super_cmCTestGenericHandler).Quiet);
        if ((ostream *)local_738._0_8_ != (ostream *)(local_738 + 0x10)) {
          operator_delete((void *)local_738._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_738._16_8_)->_M_p + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_698);
        std::ios_base::~ios_base(local_628);
        bVar4 = cmCTest::RunMakeCommand
                          ((this->super_cmCTestGenericHandler).CTest,&local_758,&local_6d8,
                           &local_77c,local_6b8._M_dataplus._M_p,(cmDuration)0x0,
                           (ostream *)local_298,Auto);
        if ((abStack_278[(long)*(_func_int **)(local_298._0_8_ + -0x18)] & 5) == 0) {
          std::ofstream::close();
        }
        if ((abStack_4e0[*(long *)(local_500._0_8_ + -0x18)] & 5) == 0) {
          cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_738,(ostream *)local_500,0);
          cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_738,
                            (this->super_cmCTestGenericHandler).AppendXML);
          cmCTest::GenerateSubprojectsOutput
                    ((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_738);
          pp_Var2 = (_func_int **)(local_698 + 0x10);
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"Configure","");
          cmXMLWriter::StartElement((cmXMLWriter *)local_738,(string *)local_698);
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"StartDateTime","");
          cmXMLWriter::StartElement((cmXMLWriter *)local_738,(string *)local_698);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_738,&local_520);
          cmXMLWriter::EndElement((cmXMLWriter *)local_738);
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_698,"StartConfigureTime","");
          cmXMLWriter::
          Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                    ((cmXMLWriter *)local_738,(string *)local_698,&local_6e0);
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"ConfigureCommand","")
          ;
          cmXMLWriter::StartElement((cmXMLWriter *)local_738,(string *)local_698);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_738,&local_758);
          cmXMLWriter::EndElement((cmXMLWriter *)local_738);
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_698);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_698,"End",3);
          std::ios::widen((char)(ostream *)local_698 +
                          (char)*(_func_int **)(local_698._0_8_ + -0x18));
          std::ostream::put((char)local_698);
          std::ostream::flush();
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                       ,0x50,local_778._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_778._M_dataplus._M_p != &local_778.field_2) {
            operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_698);
          std::ios_base::~ios_base(local_628);
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"Log","");
          cmXMLWriter::StartElement((cmXMLWriter *)local_738,(string *)local_698);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_738,&local_6d8);
          cmXMLWriter::EndElement((cmXMLWriter *)local_738);
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"ConfigureStatus","");
          cmXMLWriter::Element<int>((cmXMLWriter *)local_738,(string *)local_698,&local_77c);
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"EndDateTime","");
          cmCTest::CurrentTime_abi_cxx11_(&local_778,(this->super_cmCTestGenericHandler).CTest);
          cmXMLWriter::StartElement((cmXMLWriter *)local_738,(string *)local_698);
          cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_738,&local_778);
          cmXMLWriter::EndElement((cmXMLWriter *)local_738);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_778._M_dataplus._M_p != &local_778.field_2) {
            operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
          }
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"EndConfigureTime","")
          ;
          local_778._M_dataplus._M_p = (pointer)std::chrono::_V2::system_clock::now();
          cmXMLWriter::
          Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                    ((cmXMLWriter *)local_738,(string *)local_698,
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&local_778);
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          local_698._0_8_ = pp_Var2;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_698,"ElapsedMinutes","");
          lVar7 = std::chrono::_V2::steady_clock::now();
          local_778._M_dataplus._M_p = (pointer)((lVar7 - lVar5) / 60000000000);
          cmXMLWriter::Element<long>
                    ((cmXMLWriter *)local_738,(string *)local_698,(long *)&local_778);
          if ((_func_int **)local_698._0_8_ != pp_Var2) {
            operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
          }
          cmXMLWriter::EndElement((cmXMLWriter *)local_738);
          cmCTest::EndXML((this->super_cmCTestGenericHandler).CTest,(cmXMLWriter *)local_738);
          cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_738);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_520._M_dataplus._M_p != &local_520.field_2) {
          operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_500);
        iVar8 = 0;
        if (!bVar4 || local_77c != 0) goto LAB_001e120a;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_298,"Cannot open configure file",0x1a);
        std::ios::widen((char)(ostream *)local_298 + (char)*(_func_int **)(local_298._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_298);
        std::ostream::flush();
        pcVar3 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestConfigureHandler.cxx"
                     ,0x35,(char *)local_698._0_8_,false);
        if ((undefined1 *)local_698._0_8_ != local_698 + 0x10) {
          operator_delete((void *)local_698._0_8_,local_688[0]._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
        std::ios_base::~ios_base(local_228);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_500);
        iVar8 = 1;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
      operator_delete(local_6d8._M_dataplus._M_p,
                      CONCAT71(local_6d8.field_2._M_allocated_capacity._1_7_,
                               local_6d8.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
LAB_001e1cb9:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
  }
  return iVar8;
}

Assistant:

int cmCTestConfigureHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "Configure project" << std::endl, this->Quiet);
  std::string cCommand =
    this->CTest->GetCTestConfiguration("ConfigureCommand");
  if (cCommand.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find ConfigureCommand key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  std::string buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  auto elapsed_time_start = std::chrono::steady_clock::now();
  std::string output;
  int retVal = 0;
  bool res = false;
  if (!this->CTest->GetShowOnly()) {
    cmGeneratedFileStream os;
    if (!this->StartResultingXML(cmCTest::PartConfigure, "Configure", os)) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Cannot open configure file" << std::endl);
      return 1;
    }
    std::string start_time = this->CTest->CurrentTime();
    auto start_time_time = std::chrono::system_clock::now();

    cmGeneratedFileStream ofs;
    this->StartLogFile("Configure", ofs);
    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Configure with command: " << cCommand << std::endl,
                       this->Quiet);
    res = this->CTest->RunMakeCommand(cCommand, output, &retVal,
                                      buildDirectory.c_str(),
                                      cmDuration::zero(), ofs);

    if (ofs) {
      ofs.close();
    }

    if (os) {
      cmXMLWriter xml(os);
      this->CTest->StartXML(xml, this->AppendXML);
      this->CTest->GenerateSubprojectsOutput(xml);
      xml.StartElement("Configure");
      xml.Element("StartDateTime", start_time);
      xml.Element("StartConfigureTime", start_time_time);
      xml.Element("ConfigureCommand", cCommand);
      cmCTestOptionalLog(this->CTest, DEBUG, "End" << std::endl, this->Quiet);
      xml.Element("Log", output);
      xml.Element("ConfigureStatus", retVal);
      xml.Element("EndDateTime", this->CTest->CurrentTime());
      xml.Element("EndConfigureTime", std::chrono::system_clock::now());
      xml.Element("ElapsedMinutes",
                  std::chrono::duration_cast<std::chrono::minutes>(
                    std::chrono::steady_clock::now() - elapsed_time_start)
                    .count());
      xml.EndElement(); // Configure
      this->CTest->EndXML(xml);
    }
  } else {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Configure with command: " << cCommand << std::endl,
                       this->Quiet);
  }
  if (!res || retVal) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error(s) when configuring the project" << std::endl);
    return -1;
  }
  return 0;
}